

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O3

int read_CPR(coda_cdf_product *product_file,int64_t offset)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  char *message;
  undefined1 auVar6 [16];
  int local_20;
  int local_1c;
  
  if (offset == 0) {
    return 0;
  }
  iVar5 = read_bytes(product_file->raw_product,offset + 8,4,&local_1c);
  if (-1 < iVar5) {
    auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_1c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_1c >> 0x10),local_1c))
                                                  >> 0x20),local_1c) >> 0x18),
                                       (char)((uint)local_1c >> 8)),(ushort)(byte)local_1c) &
                     0xffffff00ffffff);
    auVar6 = pshuflw(auVar6,auVar6,0x1b);
    sVar1 = auVar6._0_2_;
    sVar2 = auVar6._2_2_;
    sVar3 = auVar6._4_2_;
    sVar4 = auVar6._6_2_;
    local_1c = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar6[6] - (0xff < sVar4),
                        CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar6[4] - (0xff < sVar3),
                                 CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar6[2] - (0xff < sVar2)
                                          ,(0 < sVar1) * (sVar1 < 0x100) * auVar6[0] -
                                           (0xff < sVar1))));
    if (local_1c == 0xb) {
      iVar5 = read_bytes(product_file->raw_product,offset + 0xc,4,&local_20);
      if (iVar5 < 0) {
        return -1;
      }
      auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )local_20 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_20 >> 0x10),local_20))
                                                  >> 0x20),local_20) >> 0x18),
                                         (char)((uint)local_20 >> 8)),(ushort)(byte)local_20) &
                       0xffffff00ffffff);
      auVar6 = pshuflw(auVar6,auVar6,0x1b);
      sVar1 = auVar6._0_2_;
      sVar2 = auVar6._2_2_;
      sVar3 = auVar6._4_2_;
      sVar4 = auVar6._6_2_;
      local_20 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar6[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar6[4] - (0xff < sVar3),
                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar6[2] -
                                            (0xff < sVar2),
                                            (0 < sVar1) * (sVar1 < 0x100) * auVar6[0] -
                                            (0xff < sVar1))));
      if (local_20 == 5) {
        return 0;
      }
      message = "Unsupported compression method (%d) for CDF variable";
      iVar5 = -200;
    }
    else {
      message = "CDF file has invalid record type (%d) for CPR record";
      iVar5 = -300;
    }
    coda_set_error(iVar5,message);
  }
  return -1;
}

Assistant:

static int read_CPR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int32_t ctype;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 11)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for CPR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 4, &ctype) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&ctype);
#endif
    if (ctype != 5)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Unsupported compression method (%d) for CDF variable", ctype);
        return -1;
    }

    return 0;
}